

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::process_markers(jpeg_decoder *this)

{
  int iVar1;
  jpeg_decoder *unaff_retaddr;
  int c;
  jpeg_decoder *in_stack_00000210;
  jpgd_status in_stack_ffffffffffffffdc;
  jpeg_decoder *in_stack_ffffffffffffffe0;
  
  do {
    iVar1 = next_marker(in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffe0 = (jpeg_decoder *)(ulong)(iVar1 - 1);
    switch(in_stack_ffffffffffffffe0) {
    case (jpeg_decoder *)0x0:
    case (jpeg_decoder *)0xc7:
    case (jpeg_decoder *)0xcf:
    case (jpeg_decoder *)0xd0:
    case (jpeg_decoder *)0xd1:
    case (jpeg_decoder *)0xd2:
    case (jpeg_decoder *)0xd3:
    case (jpeg_decoder *)0xd4:
    case (jpeg_decoder *)0xd5:
    case (jpeg_decoder *)0xd6:
      stop_decoding(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    default:
      skip_variable_marker(in_stack_ffffffffffffffe0);
      break;
    case (jpeg_decoder *)0xbf:
    case (jpeg_decoder *)0xc0:
    case (jpeg_decoder *)0xc1:
    case (jpeg_decoder *)0xc2:
    case (jpeg_decoder *)0xc4:
    case (jpeg_decoder *)0xc5:
    case (jpeg_decoder *)0xc6:
    case (jpeg_decoder *)0xc8:
    case (jpeg_decoder *)0xc9:
    case (jpeg_decoder *)0xca:
    case (jpeg_decoder *)0xcc:
    case (jpeg_decoder *)0xcd:
    case (jpeg_decoder *)0xce:
    case (jpeg_decoder *)0xd7:
    case (jpeg_decoder *)0xd8:
    case (jpeg_decoder *)0xd9:
      return iVar1;
    case (jpeg_decoder *)0xc3:
      read_dht_marker(in_stack_00000210);
      break;
    case (jpeg_decoder *)0xcb:
      stop_decoding(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    case (jpeg_decoder *)0xda:
      read_dqt_marker(unaff_retaddr);
      break;
    case (jpeg_decoder *)0xdc:
      read_dri_marker(in_stack_ffffffffffffffe0);
    }
  } while( true );
}

Assistant:

int jpeg_decoder::process_markers()
	{
		int c;

		for (; ; )
		{
			c = next_marker();

			switch (c)
			{
			case M_SOF0:
			case M_SOF1:
			case M_SOF2:
			case M_SOF3:
			case M_SOF5:
			case M_SOF6:
			case M_SOF7:
				//      case M_JPG:
			case M_SOF9:
			case M_SOF10:
			case M_SOF11:
			case M_SOF13:
			case M_SOF14:
			case M_SOF15:
			case M_SOI:
			case M_EOI:
			case M_SOS:
			{
				return c;
			}
			case M_DHT:
			{
				read_dht_marker();
				break;
			}
			// No arithmitic support - dumb patents!
			case M_DAC:
			{
				stop_decoding(JPGD_NO_ARITHMITIC_SUPPORT);
				break;
			}
			case M_DQT:
			{
				read_dqt_marker();
				break;
			}
			case M_DRI:
			{
				read_dri_marker();
				break;
			}
			//case M_APP0:  /* no need to read the JFIF marker */
			case M_JPG:
			case M_RST0:    /* no parameters */
			case M_RST1:
			case M_RST2:
			case M_RST3:
			case M_RST4:
			case M_RST5:
			case M_RST6:
			case M_RST7:
			case M_TEM:
			{
				stop_decoding(JPGD_UNEXPECTED_MARKER);
				break;
			}
			default:    /* must be DNL, DHP, EXP, APPn, JPGn, COM, or RESn or APP0 */
			{
				skip_variable_marker();
				break;
			}
			}
		}
	}